

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O1

int Saig_ManBmcRunTerSim_rec(Gia_ManBmc_t *p,Aig_Obj_t *pObj,int iFrame)

{
  int iVar1;
  void *pvVar2;
  Aig_Man_t *pAVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  
  if ((-1 < iFrame) && (iFrame < p->vTerInfo->nSize)) {
    pvVar2 = p->vTerInfo->pArray[(uint)iFrame];
    uVar9 = *(uint *)((long)pvVar2 + (long)(pObj->Id >> 4) * 4) >> ((char)pObj->Id * '\x02' & 0x1fU)
            & 3;
    if (uVar9 != 0) {
      return uVar9;
    }
    uVar9 = (uint)*(undefined8 *)&pObj->field_0x18;
    uVar8 = uVar9 & 7;
    if (uVar8 == 3) {
      uVar8 = Saig_ManBmcRunTerSim_rec
                        (p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),iFrame);
      uVar9 = uVar8;
      if (((ulong)pObj->pFanin0 & 1) != 0) {
        uVar9 = 2;
        if (uVar8 != 1) {
          uVar9 = (uint)(uVar8 != 2) * 2 + 1;
        }
      }
    }
    else if ((uVar8 == 2) && (pAVar3 = p->pAig, pAVar3->nTruePis <= (pObj->field_0).CioId)) {
      if (iFrame == 0) {
        __assert_fail("iFrame > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmc3.c"
                      ,0x4c6,"int Saig_ManBmcRunTerSim_rec(Gia_ManBmc_t *, Aig_Obj_t *, int)");
      }
      if ((pObj->field_0).CioId < pAVar3->nTruePis) {
        __assert_fail("Saig_ObjIsLo(p, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saig.h"
                      ,0x56,"Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)");
      }
      uVar9 = ((pObj->field_0).CioId - pAVar3->nTruePis) + pAVar3->nTruePos;
      if (((int)uVar9 < 0) || (pAVar3->vCos->nSize <= (int)uVar9)) goto LAB_00560a1d;
      uVar9 = Saig_ManBmcRunTerSim_rec(p,(Aig_Obj_t *)pAVar3->vCos->pArray[uVar9],iFrame + -1);
    }
    else {
      if ((uVar9 & 7) - 7 < 0xfffffffe) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmc3.c"
                      ,0x4d3,"int Saig_ManBmcRunTerSim_rec(Gia_ManBmc_t *, Aig_Obj_t *, int)");
      }
      iVar5 = Saig_ManBmcRunTerSim_rec
                        (p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),iFrame);
      iVar6 = Saig_ManBmcRunTerSim_rec
                        (p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),iFrame);
      iVar1 = (uint)(iVar5 != 2) * 2 + 1;
      if (iVar5 == 1) {
        iVar1 = 2;
      }
      if (((ulong)pObj->pFanin0 & 1) == 0) {
        iVar1 = iVar5;
      }
      iVar5 = (uint)(iVar6 != 2) * 2 + 1;
      if (iVar6 == 1) {
        iVar5 = 2;
      }
      if (((ulong)pObj->pFanin1 & 1) == 0) {
        iVar5 = iVar6;
      }
      uVar9 = (iVar5 == 2 && iVar1 == 2) ^ 3;
      if (iVar5 == 1) {
        uVar9 = 1;
      }
      if (iVar1 == 1) {
        uVar9 = 1;
      }
    }
    lVar7 = (long)(pObj->Id >> 4);
    uVar8 = *(uint *)((long)pvVar2 + lVar7 * 4);
    bVar4 = (char)pObj->Id * '\x02';
    *(uint *)((long)pvVar2 + lVar7 * 4) =
         (uVar8 >> (bVar4 & 0x1f) & 3 ^ uVar9) << (bVar4 & 0x1f) ^ uVar8;
    iVar1 = pObj->Id;
    if (-1 < (long)iVar1) {
      iVar5 = p->vMapping->nSize;
      if (iVar1 < iVar5) {
        iVar1 = p->vMapping->pArray[iVar1];
        if ((iVar1 != 0) && ((iVar1 < 0 || (iVar5 <= iVar1)))) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        if (uVar9 == 3) {
          return 3;
        }
        if (iVar1 == 0) {
          return uVar9;
        }
        Saig_ManBmcSetLiteral(p,pObj,iFrame,(uint)(uVar9 == 2));
        return uVar9;
      }
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
LAB_00560a1d:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int Saig_ManBmcRunTerSim_rec( Gia_ManBmc_t * p, Aig_Obj_t * pObj, int iFrame )
{
    unsigned * pInfo = (unsigned *)Vec_PtrEntry( p->vTerInfo, iFrame );
    int Val0, Val1, Value = Saig_ManBmcSimInfoGet( pInfo, pObj );
    if ( Value != SAIG_TER_NON )
    {
/*
        // check the value of this literal in the SAT solver
        if ( Value == SAIG_TER_UND && Saig_ManBmcMapping(p, pObj) )
        {
            int Lit = Saig_ManBmcLiteral( p, pObj, iFrame );
            if ( Lit >= 0  )
            {
                assert( Lit >= 2 );
                if ( p->pSat->assigns[Abc_Lit2Var(Lit)] < 2 )
                {
                    p->nUniProps++;
                    if ( Abc_LitIsCompl(Lit) ^ (p->pSat->assigns[Abc_Lit2Var(Lit)] == 0) )
                        Value = SAIG_TER_ONE;
                    else
                        Value = SAIG_TER_ZER;

//                    Value = SAIG_TER_UND;  // disable!

                    // use the new value
                    Saig_ManBmcSimInfoSet( pInfo, pObj, Value );
                    // transfer to the unrolling
                    if ( Value != SAIG_TER_UND )
                        Saig_ManBmcSetLiteral( p, pObj, iFrame, (int)(Value == SAIG_TER_ONE) );
                }
            }
        }
*/
        return Value;
    }
    if ( Aig_ObjIsCo(pObj) )
    {
        Value = Saig_ManBmcRunTerSim_rec( p, Aig_ObjFanin0(pObj), iFrame );
        if ( Aig_ObjFaninC0(pObj) )
            Value = Saig_ManBmcSimInfoNot( Value );
    }
    else if ( Saig_ObjIsLo(p->pAig, pObj) )
    {
        assert( iFrame > 0 );
        Value = Saig_ManBmcRunTerSim_rec( p, Saig_ObjLoToLi(p->pAig, pObj), iFrame - 1 );
    }
    else if ( Aig_ObjIsNode(pObj) )
    {
        Val0 = Saig_ManBmcRunTerSim_rec( p, Aig_ObjFanin0(pObj), iFrame  );
        Val1 = Saig_ManBmcRunTerSim_rec( p, Aig_ObjFanin1(pObj), iFrame  );
        if ( Aig_ObjFaninC0(pObj) )
            Val0 = Saig_ManBmcSimInfoNot( Val0 );
        if ( Aig_ObjFaninC1(pObj) )
            Val1 = Saig_ManBmcSimInfoNot( Val1 );
        Value = Saig_ManBmcSimInfoAnd( Val0, Val1 );
    }
    else assert( 0 );
    Saig_ManBmcSimInfoSet( pInfo, pObj, Value );
    // transfer to the unrolling
    if ( Saig_ManBmcMapping(p, pObj) && Value != SAIG_TER_UND )
        Saig_ManBmcSetLiteral( p, pObj, iFrame, (int)(Value == SAIG_TER_ONE) );
    return Value;
}